

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolList.hpp
# Opt level: O2

DebugClient * __thiscall
PoolList<ProxyServer::DebugClient>::append<ProxyServer::DebugListener&,Server::Client&>
          (PoolList<ProxyServer::DebugClient> *this,DebugListener *a,Client *b)

{
  DebugClient *pDVar1;
  
  pDVar1 = allocateFreeItem(this);
  (pDVar1->super_ICallback)._vptr_ICallback = (_func_int **)&PTR_onRead_00122ce8;
  pDVar1->_parent = a;
  pDVar1->_handle = b;
  pDVar1 = linkFreeItem(this,pDVar1);
  return pDVar1;
}

Assistant:

T& append(A a, B b) {return linkFreeItem(new (allocateFreeItem()) T(a, b));}